

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lunasvg.cpp
# Opt level: O0

bool lunasvg_add_font_face_from_data
               (char *family,bool bold,bool italic,void *data,size_t length,
               lunasvg_destroy_func_t destroy_func,void *closure)

{
  byte bVar1;
  byte bVar2;
  char *__s;
  bool bVar3;
  FontFaceCache *this;
  FontFace local_70 [3];
  allocator<char> local_51;
  string local_50;
  lunasvg_destroy_func_t local_30;
  lunasvg_destroy_func_t destroy_func_local;
  size_t length_local;
  void *data_local;
  bool italic_local;
  char *pcStack_10;
  bool bold_local;
  char *family_local;
  
  local_30 = destroy_func;
  destroy_func_local = (lunasvg_destroy_func_t)length;
  length_local = (size_t)data;
  data_local._6_1_ = italic;
  data_local._7_1_ = bold;
  pcStack_10 = family;
  this = lunasvg::fontFaceCache();
  __s = pcStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
  bVar2 = data_local._7_1_;
  bVar1 = data_local._6_1_;
  lunasvg::FontFace::FontFace
            (local_70,(void *)length_local,(size_t)destroy_func_local,local_30,closure);
  bVar3 = lunasvg::FontFaceCache::addFontFace
                    (this,&local_50,(bool)(bVar2 & 1),(bool)(bVar1 & 1),local_70);
  lunasvg::FontFace::~FontFace(local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  return bVar3;
}

Assistant:

bool lunasvg_add_font_face_from_data(const char* family, bool bold, bool italic, const void* data, size_t length, lunasvg_destroy_func_t destroy_func, void* closure)
{
    return lunasvg::fontFaceCache()->addFontFace(family, bold, italic, lunasvg::FontFace(data, length, destroy_func, closure));
}